

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.cpp
# Opt level: O0

CScript * __thiscall
anon_unknown.dwarf_1791efa::CScriptVisitor::operator()(CScriptVisitor *this,WitnessUnknown *id)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  uint uVar2;
  opcodetype oVar3;
  span<const_unsigned_char,_18446744073709551615UL> *this_00;
  CScript *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa4;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CScript::CScript((CScript *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  uVar2 = WitnessUnknown::GetWitnessVersion
                    ((WitnessUnknown *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                    );
  oVar3 = CScript::EncodeOP_N(in_stack_ffffffffffffff68);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffffa4,uVar2),
                      (opcodetype)((ulong)in_RDI >> 0x20));
  this_00 = (span<const_unsigned_char,_18446744073709551615UL> *)
            WitnessUnknown::GetWitnessProgram
                      ((WitnessUnknown *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            (this_00,in_stack_ffffffffffffff70);
  b._M_ptr._4_4_ = in_stack_ffffffffffffffa4;
  b._M_ptr._0_4_ = uVar2;
  b._M_extent._M_extent_value = in_stack_ffffffffffffffa8._M_extent_value;
  CScript::operator<<((CScript *)CONCAT44(oVar3,in_stack_ffffffffffffff88),b);
  CScript::CScript((CScript *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (CScript *)0xd6897c);
  CScript::~CScript((CScript *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CScript operator()(const WitnessUnknown& id) const
    {
        return CScript() << CScript::EncodeOP_N(id.GetWitnessVersion()) << id.GetWitnessProgram();
    }